

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void STATE_board_print_debug(chess_state_t *s)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  bool bVar9;
  
  lVar1 = 7;
  do {
    fprintf(_stdout,"#%c ",(ulong)((int)lVar1 + 0x31));
    lVar8 = 0;
    do {
      uVar2 = 1L << ((char)lVar8 + (char)lVar1 * '\b' & 0x3fU);
      cVar5 = '-';
      bVar4 = false;
      lVar6 = 0;
      bVar9 = true;
      do {
        bVar3 = bVar9;
        if ((s->bitboard[lVar6 + 6] & uVar2) != 0) {
          if ((s->bitboard[lVar6] & uVar2) != 0) {
            cVar5 = 'P';
          }
          if ((s->bitboard[lVar6 + 1] & uVar2) != 0) {
            cVar5 = 'N';
          }
          if ((s->bitboard[lVar6 + 2] & uVar2) != 0) {
            cVar5 = 'B';
          }
          if ((s->bitboard[lVar6 + 3] & uVar2) != 0) {
            cVar5 = 'R';
          }
          if ((s->bitboard[lVar6 + 4] & uVar2) != 0) {
            cVar5 = 'Q';
          }
          cVar7 = cVar5;
          if ((s->bitboard[lVar6 + 5] & uVar2) != 0) {
            cVar7 = 'K';
          }
          cVar5 = cVar7 + ' ';
          if (!bVar4) {
            cVar5 = cVar7;
          }
        }
        lVar6 = 7;
        bVar4 = true;
        bVar9 = false;
      } while (bVar3);
      fprintf(_stdout,"%c ",(ulong)(uint)(int)cVar5);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    fputc(10,_stdout);
    bVar9 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar9);
  fwrite("   A B C D E F G H\n",0x13,1,_stdout);
  return;
}

Assistant:

void STATE_board_print_debug(const chess_state_t *s)
{
    int rank, file, color;
    for(rank = 7; rank >= 0; rank--) {
        fprintf(stdout, "#%c ", rank + '1');
        for(file = 0; file < 8; file++) {
            char c = '-';
            for(color = WHITE; color <= BLACK; color++) {
                if(s->bitboard[color*NUM_TYPES+ALL] & BITBOARD_RANK_FILE(rank, file)) {
                    if(s->bitboard[color*NUM_TYPES+PAWN] & BITBOARD_RANK_FILE(rank, file)) c = 'P';
                    if(s->bitboard[color*NUM_TYPES+KNIGHT] & BITBOARD_RANK_FILE(rank, file)) c = 'N';
                    if(s->bitboard[color*NUM_TYPES+BISHOP] & BITBOARD_RANK_FILE(rank, file)) c = 'B';
                    if(s->bitboard[color*NUM_TYPES+ROOK] & BITBOARD_RANK_FILE(rank, file)) c = 'R';
                    if(s->bitboard[color*NUM_TYPES+QUEEN] & BITBOARD_RANK_FILE(rank, file)) c = 'Q';
                    if(s->bitboard[color*NUM_TYPES+KING] & BITBOARD_RANK_FILE(rank, file)) c = 'K';
                    if(color == BLACK) c += 32;
                }
            }
            fprintf(stdout, "%c ", c);
        }
        fprintf(stdout, "\n");
    }
    fprintf(stdout, "   A B C D E F G H\n");
}